

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_capabilities.cpp
# Opt level: O1

unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> __thiscall
pfederc::Parser::parseCapabilities(Parser *this)

{
  Token *pTVar1;
  size_t sVar2;
  pointer puVar3;
  size_t sVar4;
  size_t sVar5;
  pointer puVar6;
  pointer puVar7;
  bool bVar8;
  Capabilities *this_00;
  _Head_base<0UL,_pfederc::Expr_*,_false> _Var9;
  Parser *in_RSI;
  bool isconstant;
  bool isinline;
  bool isunused;
  vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ensures;
  vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  requires;
  bool local_8b;
  bool local_8a;
  bool local_89;
  _Head_base<0UL,_pfederc::Capabilities_*,_false> local_88;
  __uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_> local_80;
  vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  local_78;
  vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  local_58;
  undefined1 local_40 [16];
  
  local_89 = false;
  local_8a = false;
  local_8b = false;
  local_58.
  super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.
  super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.
  super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_80._M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
  super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
       (tuple<pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>)
       (tuple<pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>)this;
  while (((bVar8 = Token::operator==(in_RSI->lexer->currentToken,TOK_ENSURE), bVar8 ||
          (bVar8 = Token::operator==(in_RSI->lexer->currentToken,TOK_DIRECTIVE), bVar8)) &&
         (bVar8 = Token::operator!=(in_RSI->lexer->currentToken,TOK_EOF), bVar8))) {
    bVar8 = Token::operator==(in_RSI->lexer->currentToken,TOK_ENSURE);
    if (bVar8) {
      parseCapabilityEnsure(in_RSI,&local_58,&local_78);
    }
    else {
      parseCapabilityDirective(in_RSI,&local_89,&local_8a,&local_8b);
    }
    bVar8 = expect(in_RSI,TOK_EOL);
    if (!bVar8) {
      pTVar1 = in_RSI->lexer->currentToken;
      local_88._M_head_impl = (Capabilities *)operator_new(0x38);
      sVar4 = (pTVar1->pos).line;
      sVar5 = (pTVar1->pos).startIndex;
      sVar2 = (pTVar1->pos).endIndex;
      (local_88._M_head_impl)->isunused = true;
      (local_88._M_head_impl)->isinline = false;
      *(SyntaxErrorCode *)&(local_88._M_head_impl)->field_0x4 = STX_ERR_EXPECTED_EOL;
      ((Position *)&(local_88._M_head_impl)->required)->line = sVar4;
      ((Position *)&(local_88._M_head_impl)->required)->startIndex = sVar5;
      ((Position *)&(local_88._M_head_impl)->required)->endIndex = sVar2;
      (((vector<pfederc::Position,_std::allocator<pfederc::Position>_> *)
       &(local_88._M_head_impl)->ensures)->
      super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (((vector<pfederc::Position,_std::allocator<pfederc::Position>_> *)
       &(local_88._M_head_impl)->ensures)->
      super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (((vector<pfederc::Position,_std::allocator<pfederc::Position>_> *)
       &(local_88._M_head_impl)->ensures)->
      super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      generateError((Parser *)(local_40 + 8),
                    (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)in_RSI);
      std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                 (local_40 + 8));
      if (local_88._M_head_impl != (Capabilities *)0x0) {
        std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                  ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)&local_88,
                   (Error<pfederc::SyntaxErrorCode> *)local_88._M_head_impl);
      }
      skipToEol(in_RSI);
    }
    while (bVar8 = Token::operator==(in_RSI->lexer->currentToken,TOK_EOL), bVar8) {
      Lexer::next(in_RSI->lexer);
    }
  }
  pTVar1 = in_RSI->lexer->currentToken;
  if ((pTVar1->type < 0x1c) && ((0xd200000U >> (pTVar1->type & 0x1f) & 1) != 0)) {
    this_00 = (Capabilities *)operator_new(0x38);
    Capabilities::Capabilities(this_00,local_89,local_8a,local_8b,&local_58,&local_78);
    _Var9._M_head_impl =
         (Expr *)local_80._M_t.
                 super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
                 super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
    local_88._M_head_impl = this_00;
    parsePrimary((Parser *)
                 local_80._M_t.
                 super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
                 super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl,
                 (unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_> *)
                 in_RSI);
    std::unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>::~unique_ptr
              ((unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_> *)
               &local_88);
  }
  else {
    local_88._M_head_impl = (Capabilities *)operator_new(0x38);
    puVar6 = (pointer)(pTVar1->pos).line;
    puVar7 = (pointer)(pTVar1->pos).startIndex;
    puVar3 = (pointer)(pTVar1->pos).endIndex;
    (local_88._M_head_impl)->isunused = true;
    (local_88._M_head_impl)->isinline = false;
    *(undefined4 *)&(local_88._M_head_impl)->field_0x4 = 0x29;
    ((local_88._M_head_impl)->required).
    super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = puVar6;
    ((local_88._M_head_impl)->required).
    super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar7;
    ((local_88._M_head_impl)->required).
    super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = puVar3;
    ((local_88._M_head_impl)->ensures).
    super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ((local_88._M_head_impl)->ensures).
    super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ((local_88._M_head_impl)->ensures).
    super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    generateError((Parser *)local_40,
                  (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)in_RSI);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)local_40)
    ;
    if (local_88._M_head_impl != (Capabilities *)0x0) {
      std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)&local_88,
                 (Error<pfederc::SyntaxErrorCode> *)local_88._M_head_impl);
    }
    *(undefined8 *)
     local_80._M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
     super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl = 0;
    _Var9._M_head_impl = (Expr *)local_80;
  }
  std::
  vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ::~vector(&local_78);
  std::
  vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ::~vector(&local_58);
  return (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
         (tuple<pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>)_Var9._M_head_impl;
}

Assistant:

std::unique_ptr<Expr> Parser::parseCapabilities() noexcept {
  bool isunused = false, isinline = false, isconstant = false;
  std::vector<std::unique_ptr<Expr>> requires;
  std::vector<std::unique_ptr<Expr>> ensures;

  while ((*lexer.getCurrentToken() == TokenType::TOK_ENSURE
      || *lexer.getCurrentToken() == TokenType::TOK_DIRECTIVE)
      && *lexer.getCurrentToken() != TokenType::TOK_EOF) {

    if (*lexer.getCurrentToken() == TokenType::TOK_ENSURE)
      parseCapabilityEnsure(requires, ensures);
    else
      parseCapabilityDirective(isunused, isinline, isconstant);

    if (!expect(TokenType::TOK_EOL)) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_EXPECTED_EOL, lexer.getCurrentToken()->getPosition()));
      skipToEol();
    }

    // skip new lines
    while (*lexer.getCurrentToken() == TokenType::TOK_EOL)
      lexer.next();
  }

  switch (lexer.getCurrentToken()->getType()) {
  case TokenType::TOK_KW_CLASS:
  case TokenType::TOK_KW_FN:
  case TokenType::TOK_KW_TRAIT:
  case TokenType::TOK_KW_TYPE:
    return parsePrimary(std::make_unique<Capabilities>(
          isunused, isinline, isconstant,
          std::move(requires), std::move(ensures)));
  default:
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_INVALID_CAPS_FOLLOWUP,
          lexer.getCurrentToken()->getPosition()));
    return nullptr;
  }
}